

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAdapter.cpp
# Opt level: O0

void __thiscall
OpenMD::EAMAdapter::makeZhou2005Oxygen
          (EAMAdapter *this,RealType re,RealType fe,RealType alpha,RealType beta,RealType A,
          RealType B,RealType kappa,RealType lambda,RealType gamma,RealType nu,
          vector<double,_std::allocator<double>_> *OrhoLimits,
          vector<double,_std::allocator<double>_> *OrhoE,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *OF)

{
  bool bVar1;
  undefined8 *in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  ZhouParameters zhouParam;
  EAMParameters eamParam;
  string *in_stack_fffffffffffffdb8;
  AtomType *in_stack_fffffffffffffdc0;
  ZhouParameters *this_00;
  ZhouParameters *__args_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  shared_ptr<OpenMD::SimpleTypeData<OpenMD::ZhouParameters>_> local_1e0;
  shared_ptr<OpenMD::GenericData> *in_stack_fffffffffffffe38;
  AtomType *in_stack_fffffffffffffe40;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  ZhouParameters *pZStack_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  ZhouParameters *pZStack_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined4 local_90;
  string local_88 [32];
  vector<double,_std::allocator<double>_> *local_68;
  vector<double,_std::allocator<double>_> *local_10;
  
  local_10 = (vector<double,_std::allocator<double>_> *)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  bVar1 = isEAM((EAMAdapter *)0x298844);
  if (bVar1) {
    AtomType::removeProperty(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    AtomType::removeProperty(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  }
  local_90 = 0;
  std::__cxx11::string::string(local_88);
  local_68 = (vector<double,_std::allocator<double>_> *)0x0;
  __args_1 = (ZhouParameters *)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x29892b);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x298951);
  __args = &local_e0;
  local_e0._M_dataplus = (_Alloc_hider)0x0;
  local_e0._1_7_ = 0;
  local_e0.field_2._M_allocated_capacity = 0;
  local_e0._M_string_length = (size_type)__args_1;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x2989e8);
  local_e0.field_2._8_8_ = 0;
  local_b8 = 0;
  pZStack_c0 = __args_1;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x298a0e);
  local_b0 = 0;
  local_a0 = 0;
  pZStack_a8 = __args_1;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)0x298a34);
  local_98 = 0;
  local_90 = 4;
  local_68 = local_10;
  std::vector<double,_std::allocator<double>_>::operator=(local_10,in_stack_fffffffffffffe58);
  std::vector<double,_std::allocator<double>_>::operator=(local_10,in_stack_fffffffffffffe58);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::operator=((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)local_10,
              (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)in_stack_fffffffffffffe58);
  std::
  make_shared<OpenMD::SimpleTypeData<OpenMD::EAMParameters>,std::__cxx11::string_const&,OpenMD::EAMParameters&>
            (__args,(EAMParameters *)__args_1);
  std::shared_ptr<OpenMD::GenericData>::
  shared_ptr<OpenMD::SimpleTypeData<OpenMD::EAMParameters>,void>
            ((shared_ptr<OpenMD::GenericData> *)in_stack_fffffffffffffdc0,
             (shared_ptr<OpenMD::SimpleTypeData<OpenMD::EAMParameters>_> *)in_stack_fffffffffffffdb8
            );
  AtomType::addProperty(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x298ba7);
  std::shared_ptr<OpenMD::SimpleTypeData<OpenMD::EAMParameters>_>::~shared_ptr
            ((shared_ptr<OpenMD::SimpleTypeData<OpenMD::EAMParameters>_> *)0x298bb1);
  this_00 = (ZhouParameters *)*in_RDI;
  std::
  make_shared<OpenMD::SimpleTypeData<OpenMD::ZhouParameters>,std::__cxx11::string_const&,OpenMD::ZhouParameters&>
            (__args,__args_1);
  std::shared_ptr<OpenMD::GenericData>::
  shared_ptr<OpenMD::SimpleTypeData<OpenMD::ZhouParameters>,void>
            ((shared_ptr<OpenMD::GenericData> *)this_00,&local_1e0);
  AtomType::addProperty(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x298c06);
  std::shared_ptr<OpenMD::SimpleTypeData<OpenMD::ZhouParameters>_>::~shared_ptr
            ((shared_ptr<OpenMD::SimpleTypeData<OpenMD::ZhouParameters>_> *)0x298c10);
  ZhouParameters::~ZhouParameters(this_00);
  EAMParameters::~EAMParameters((EAMParameters *)0x298c2a);
  return;
}

Assistant:

void EAMAdapter::makeZhou2005Oxygen(RealType re, RealType fe, RealType alpha,
                                      RealType beta, RealType A, RealType B,
                                      RealType kappa, RealType lambda,
                                      RealType gamma, RealType nu,
                                      std::vector<RealType> OrhoLimits,
                                      std::vector<RealType> OrhoE,
                                      std::vector<std::vector<RealType>> OF) {
    if (isEAM()) {
      at_->removeProperty(EAMtypeID);
      at_->removeProperty(ZhouTypeID);
    }

    EAMParameters eamParam {};
    ZhouParameters zhouParam {};

    eamParam.eamType = eamZhou2005Oxygen;

    eamParam.latticeConstant = re;

    zhouParam.re         = re;
    zhouParam.fe         = fe;
    zhouParam.alpha      = alpha;
    zhouParam.beta       = beta;
    zhouParam.A          = A;
    zhouParam.B          = B;
    zhouParam.kappa      = kappa;
    zhouParam.lambda     = lambda;
    zhouParam.gamma      = gamma;
    zhouParam.nu         = nu;
    zhouParam.OrhoLimits = OrhoLimits;
    zhouParam.OrhoE      = OrhoE;
    zhouParam.OF         = OF;

    at_->addProperty(std::make_shared<EAMData>(EAMtypeID, eamParam));
    at_->addProperty(std::make_shared<ZhouData>(ZhouTypeID, zhouParam));
  }